

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseErrorTest_EnumReservedInvalidIdentifier_Test::
~ParseErrorTest_EnumReservedInvalidIdentifier_Test
          (ParseErrorTest_EnumReservedInvalidIdentifier_Test *this)

{
  ParserTest::~ParserTest(&this->super_ParseErrorTest);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseErrorTest, EnumReservedInvalidIdentifier) {
  ExpectHasWarnings(
      R"schema(
        enum TestEnum {
          FOO = 1;
          reserved "foo bar";
        }
      )schema",
      "3:19: Reserved name \"foo bar\" is not a valid identifier.\n");
}